

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

hash_code llvm::detail::hash_value(DoubleAPFloat *Arg)

{
  bool bVar1;
  type pAVar2;
  hash_code local_28;
  hash_code local_20;
  DoubleAPFloat *local_18;
  DoubleAPFloat *Arg_local;
  
  local_18 = Arg;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&Arg->Floats);
  if (bVar1) {
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&local_18->Floats,0);
    local_20 = llvm::hash_value(pAVar2);
    pAVar2 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&local_18->Floats,1);
    local_28 = llvm::hash_value(pAVar2);
    Arg_local = (DoubleAPFloat *)hash_combine<llvm::hash_code,llvm::hash_code>(&local_20,&local_28);
  }
  else {
    Arg_local = (DoubleAPFloat *)hash_combine<llvm::fltSemantics_const*>(&local_18->Semantics);
  }
  return (hash_code)(size_t)Arg_local;
}

Assistant:

hash_code hash_value(const DoubleAPFloat &Arg) {
  if (Arg.Floats)
    return hash_combine(hash_value(Arg.Floats[0]), hash_value(Arg.Floats[1]));
  return hash_combine(Arg.Semantics);
}